

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

Matrix __thiscall Matrix::operator+(Matrix *this,Matrix *other)

{
  int cols;
  int rows;
  double *pdVar1;
  long lVar2;
  uint uVar3;
  double *data;
  runtime_error *this_00;
  long *in_RDX;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Matrix MVar7;
  
  cols = *(int *)((long)in_RDX + 0xc);
  if ((cols == other->cols) && (rows = (int)in_RDX[1], rows == other->rows)) {
    uVar3 = rows * cols;
    uVar4 = 0;
    uVar5 = 0xffffffffffffffff;
    if (-1 < (int)uVar3) {
      uVar5 = (long)(int)uVar3 * 8;
    }
    uVar6 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar6 = uVar4;
    }
    data = (double *)operator_new__(uVar5);
    pdVar1 = other->data;
    lVar2 = *in_RDX;
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      data[uVar4] = pdVar1[uVar4] + *(double *)(lVar2 + uVar4 * 8);
    }
    MVar7 = FromArray(this,data,rows,cols);
    MVar7.data = (double *)this;
    return MVar7;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Matrix Matrix::operator+(const Matrix& other) const
{
    if (other.cols != cols || other.rows != rows)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    auto* aData = new double[rows * cols];
    for (int i = 0; i < rows * cols; ++i)
    {
        aData[i] = data[i] + other.data[i];
    }

    return FromArray(aData, rows, cols);
}